

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_exception_primitive_ensure
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  undefined1 local_78 [8];
  sysbvm_stackFrameCleanupRecord_t cleanUpRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_tuple_t *block;
  sysbvm_tuple_t *body;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,8);
  memset(&cleanUpRecord.action,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&cleanUpRecord.action);
  local_78 = (undefined1  [8])0x0;
  cleanUpRecord.previous._0_4_ = 8;
  cleanUpRecord._8_8_ = arguments[1];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_78);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_function_apply0(context,*arguments);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_78);
  sysbvm_function_apply0(context,cleanUpRecord._8_8_);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&cleanUpRecord.action);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_exception_primitive_ensure(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *body = arguments + 0;
    sysbvm_tuple_t *block = arguments + 1;

    struct {
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameCleanupRecord_t cleanUpRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP,
        .action = *block,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&cleanUpRecord);

    gcFrame.result = sysbvm_function_apply0(context, *body);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&cleanUpRecord);

    sysbvm_function_apply0(context, cleanUpRecord.action);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}